

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall CTxMemPool::CTxMemPool(CTxMemPool *this,Options opts,bilingual_str *error)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 uVar4;
  int64_t iVar5;
  int iVar6;
  long lVar7;
  Options *pOVar8;
  Options *pOVar9;
  long in_FS_OFFSET;
  byte bVar10;
  char *local_c0;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i = 0;
  this->totalTxSize = 0;
  this->m_total_fee = 0;
  this->cachedInnerUsage = 0;
  iVar5 = GetTime();
  this->lastRollingFeeUpdate = iVar5;
  this->blockSinceLastRollingFeeBump = false;
  this->rollingMinimumFeeRate = 0.0;
  (this->m_epoch).m_raw_epoch = 0;
  *(undefined8 *)&(this->m_epoch).m_guarded = 0;
  this->m_sequence_number = 1;
  this->m_load_tried = false;
  *(undefined8 *)
   ((long)&(this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::multi_index_container(&this->mapTx);
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar6 = 1000000;
  if (opts.check_ratio < 1000000) {
    iVar6 = opts.check_ratio;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  opts.check_ratio = iVar6;
  lVar7 = opts.limits.descendant_size_vbytes * 0x28;
  if ((opts.max_size_bytes < 0) || (opts.max_size_bytes < lVar7)) {
    paVar2 = &local_b8.original.field_2;
    local_c0 = (char *)0x22;
    local_b8.original._M_dataplus._M_p = (pointer)paVar2;
    local_b8.original._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_b8.original,(size_type *)&local_c0,0);
    local_b8.original.field_2._M_allocated_capacity = (size_type)local_c0;
    builtin_strncpy(local_b8.original._M_dataplus._M_p,"-maxmempool must be at least %d MB",0x22);
    local_b8.original._M_string_length = (size_type)local_c0;
    local_b8.original._M_dataplus._M_p[(long)local_c0] = '\0';
    paVar3 = &local_b8.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c0 = (char *)0x22;
      local_b8.translated._M_dataplus._M_p = (pointer)paVar3;
      local_b8.translated._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_b8.translated,(size_type *)&local_c0,0);
      local_b8.translated.field_2._M_allocated_capacity = (size_type)local_c0;
      builtin_strncpy(local_b8.translated._M_dataplus._M_p,"-maxmempool must be at least %d MB",0x22
                     );
      local_b8.translated._M_string_length = (size_type)local_c0;
      local_b8.translated._M_dataplus._M_p[(long)local_c0] = '\0';
    }
    else {
      local_c0 = "-maxmempool must be at least %d MB";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_b8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_c0);
    }
    local_c0 = (char *)ceil((double)lVar7 / 1000000.0);
    tinyformat::format<double>(&local_78,&local_b8,(double *)&local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_78.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      (ulong)(local_b8.translated.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      (ulong)(local_b8.original.field_2._M_allocated_capacity + 1));
    }
  }
  pOVar8 = &opts;
  pOVar9 = &this->m_opts;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar4 = *(undefined4 *)&pOVar8->field_0x4;
    pOVar9->check_ratio = pOVar8->check_ratio;
    *(undefined4 *)&pOVar9->field_0x4 = uVar4;
    pOVar8 = (Options *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
    pOVar9 = (Options *)((long)pOVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool::CTxMemPool(Options opts, bilingual_str& error)
    : m_opts{Flatten(std::move(opts), error)}
{
}